

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O3

float trng::math::detail::GammaQ_asympt<float>(float a,float x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (x - a) / a;
  fVar1 = mln1p<float>(fVar3);
  fVar2 = fVar1 + fVar1;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar3 = (float)((uint)ABS(fVar2) | (uint)fVar3 & 0x80000000);
  fVar2 = a * 0.5;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = erfcf(fVar3 * fVar2);
  fVar1 = GammaPQ_asympt_R<float>(a,fVar3,fVar1);
  return fVar1 + fVar2 * 0.5;
}

Assistant:

TRNG_CUDA_ENABLE T GammaQ_asympt(T a, T x) {
        const T mu{(x - a) / a};
        const T eta_squared_half{mln1p(mu)};
        const T eta{copysign(sqrt(2 * eta_squared_half), mu)};
        const T leading{erfc(eta * sqrt(a / 2)) / 2};
        const T correction{GammaPQ_asympt_R(a, eta, eta_squared_half)};
        return leading + correction;
      }